

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

uint Ivy_DecGetVar(Ivy_Dec_t *pNode,int iNum)

{
  Ivy_Dec_t IVar1;
  uint uVar2;
  
  if ((uint)iNum < 6) {
    IVar1 = *pNode;
    switch(iNum) {
    case 0:
      uVar2 = (uint)IVar1 >> 8;
      break;
    case 1:
      uVar2 = (uint)IVar1 >> 0xc;
      break;
    case 2:
      uVar2 = (uint)IVar1 >> 0x10;
      break;
    case 3:
      uVar2 = (uint)IVar1 >> 0x14;
      break;
    case 4:
      uVar2 = (uint)IVar1 >> 0x18;
      break;
    case 5:
      return (uint)IVar1 >> 0x1c;
    }
    return uVar2 & 0xf;
  }
  __assert_fail("iNum >= 0 && iNum <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                ,0x84,"unsigned int Ivy_DecGetVar(Ivy_Dec_t *, int)");
}

Assistant:

static inline unsigned   Ivy_DecGetVar( Ivy_Dec_t * pNode, int iNum )
{
    assert( iNum >= 0 && iNum <= 5 );
    switch( iNum )
    {
        case 0: return pNode->Fan0;
        case 1: return pNode->Fan1;
        case 2: return pNode->Fan2;
        case 3: return pNode->Fan3;
        case 4: return pNode->Fan4;
        case 5: return pNode->Fan5;
    }
    return ~0;
}